

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rds.cc
# Opt level: O2

Rds * aliyun::Rds::CreateRdsClient(string *endpoint,string *appid,string *secret)

{
  Rds *this;
  allocator<char> local_e9;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string host_name;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)endpoint);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Rds",&local_e9);
  AliGetEndpointHost(&host_name,&local_48,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  if (host_name._M_string_length == 0) {
    this = (Rds *)0x0;
  }
  else {
    this = (Rds *)operator_new(0x38);
    std::__cxx11::string::string((string *)&local_a8,(string *)&host_name);
    std::__cxx11::string::string((string *)&local_c8,(string *)appid);
    std::__cxx11::string::string((string *)&local_e8,(string *)secret);
    Rds(this,&local_a8,&local_c8,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  std::__cxx11::string::~string((string *)&host_name);
  return this;
}

Assistant:

Rds* Rds::CreateRdsClient(std::string endpoint, std::string appid, std::string secret) {
    std::string host_name = AliGetEndpointHost(endpoint, "Rds");
    if(host_name.empty()) {
      return NULL;
    }
    return new Rds(host_name, appid, secret);
  }